

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void Translate(ExpressionTranslateContext *ctx,ExprBase *expression)

{
  bool bVar1;
  ExprVoid *expression_00;
  ExprBoolLiteral *expression_01;
  ExprCharacterLiteral *expression_02;
  ExprStringLiteral *expression_03;
  ExprIntegerLiteral *expression_04;
  ExprRationalLiteral *expression_05;
  ExprTypeLiteral *expression_06;
  ExprNullptrLiteral *expression_07;
  ExprFunctionIndexLiteral *expression_08;
  ExprPassthrough *expression_09;
  ExprArray *expression_10;
  ExprPreModify *expression_11;
  ExprPostModify *expression_12;
  ExprTypeCast *expression_13;
  ExprUnaryOp *expression_14;
  ExprBinaryOp *expression_15;
  ExprGetAddress *expression_16;
  ExprDereference *expression_17;
  ExprUnboxing *expression_18;
  ExprConditional *expression_19;
  ExprAssignment *expression_20;
  ExprMemberAccess *expression_21;
  ExprArrayIndex *expression_22;
  ExprReturn *expression_23;
  ExprYield *expression_24;
  ExprVariableDefinition *expression_25;
  ExprZeroInitialize *expression_26;
  ExprArraySetup *expression_27;
  ExprVariableDefinitions *expression_28;
  ExprVariableAccess *expression_29;
  ExprFunctionContextAccess *expression_30;
  ExprFunctionDefinition *expression_31;
  ExprGenericFunctionPrototype *expression_32;
  ExprFunctionAccess *expression_33;
  ExprFunctionCall *expression_34;
  ExprAliasDefinition *expression_35;
  ExprClassPrototype *expression_36;
  ExprGenericClassPrototype *expression_37;
  ExprClassDefinition *expression_38;
  ExprEnumDefinition *expression_39;
  ExprIfElse *expression_40;
  ExprFor *expression_41;
  ExprWhile *expression_42;
  ExprDoWhile *expression_43;
  ExprSwitch *expression_44;
  ExprBreak *expression_45;
  ExprContinue *expression_46;
  ExprBlock *expression_47;
  ExprSequence *expression_48;
  ExprSequence *expr_48;
  ExprBlock *expr_47;
  ExprContinue *expr_46;
  ExprBreak *expr_45;
  ExprSwitch *expr_44;
  ExprDoWhile *expr_43;
  ExprWhile *expr_42;
  ExprFor *expr_41;
  ExprIfElse *expr_40;
  ExprEnumDefinition *expr_39;
  ExprClassDefinition *expr_38;
  ExprGenericClassPrototype *expr_37;
  ExprClassPrototype *expr_36;
  ExprAliasDefinition *expr_35;
  ExprFunctionCall *expr_34;
  ExprFunctionAccess *expr_33;
  ExprGenericFunctionPrototype *expr_32;
  ExprFunctionDefinition *expr_31;
  ExprFunctionContextAccess *expr_30;
  ExprVariableAccess *expr_29;
  ExprVariableDefinitions *expr_28;
  ExprArraySetup *expr_27;
  ExprZeroInitialize *expr_26;
  ExprVariableDefinition *expr_25;
  ExprYield *expr_24;
  ExprReturn *expr_23;
  ExprArrayIndex *expr_22;
  ExprMemberAccess *expr_21;
  ExprAssignment *expr_20;
  ExprConditional *expr_19;
  ExprUnboxing *expr_18;
  ExprDereference *expr_17;
  ExprGetAddress *expr_16;
  ExprBinaryOp *expr_15;
  ExprUnaryOp *expr_14;
  ExprTypeCast *expr_13;
  ExprPostModify *expr_12;
  ExprPreModify *expr_11;
  ExprArray *expr_10;
  ExprPassthrough *expr_9;
  ExprFunctionIndexLiteral *expr_8;
  ExprNullptrLiteral *expr_7;
  ExprTypeLiteral *expr_6;
  ExprRationalLiteral *expr_5;
  ExprIntegerLiteral *expr_4;
  ExprStringLiteral *expr_3;
  ExprCharacterLiteral *expr_2;
  ExprBoolLiteral *expr_1;
  ExprVoid *expr;
  ExprBase *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  expression_00 = getType<ExprVoid>(expression);
  if (expression_00 == (ExprVoid *)0x0) {
    expression_01 = getType<ExprBoolLiteral>(expression);
    if (expression_01 == (ExprBoolLiteral *)0x0) {
      expression_02 = getType<ExprCharacterLiteral>(expression);
      if (expression_02 == (ExprCharacterLiteral *)0x0) {
        expression_03 = getType<ExprStringLiteral>(expression);
        if (expression_03 == (ExprStringLiteral *)0x0) {
          expression_04 = getType<ExprIntegerLiteral>(expression);
          if (expression_04 == (ExprIntegerLiteral *)0x0) {
            expression_05 = getType<ExprRationalLiteral>(expression);
            if (expression_05 == (ExprRationalLiteral *)0x0) {
              expression_06 = getType<ExprTypeLiteral>(expression);
              if (expression_06 == (ExprTypeLiteral *)0x0) {
                expression_07 = getType<ExprNullptrLiteral>(expression);
                if (expression_07 == (ExprNullptrLiteral *)0x0) {
                  expression_08 = getType<ExprFunctionIndexLiteral>(expression);
                  if (expression_08 == (ExprFunctionIndexLiteral *)0x0) {
                    expression_09 = getType<ExprPassthrough>(expression);
                    if (expression_09 == (ExprPassthrough *)0x0) {
                      expression_10 = getType<ExprArray>(expression);
                      if (expression_10 == (ExprArray *)0x0) {
                        expression_11 = getType<ExprPreModify>(expression);
                        if (expression_11 == (ExprPreModify *)0x0) {
                          expression_12 = getType<ExprPostModify>(expression);
                          if (expression_12 == (ExprPostModify *)0x0) {
                            expression_13 = getType<ExprTypeCast>(expression);
                            if (expression_13 == (ExprTypeCast *)0x0) {
                              expression_14 = getType<ExprUnaryOp>(expression);
                              if (expression_14 == (ExprUnaryOp *)0x0) {
                                expression_15 = getType<ExprBinaryOp>(expression);
                                if (expression_15 == (ExprBinaryOp *)0x0) {
                                  expression_16 = getType<ExprGetAddress>(expression);
                                  if (expression_16 == (ExprGetAddress *)0x0) {
                                    expression_17 = getType<ExprDereference>(expression);
                                    if (expression_17 == (ExprDereference *)0x0) {
                                      expression_18 = getType<ExprUnboxing>(expression);
                                      if (expression_18 == (ExprUnboxing *)0x0) {
                                        expression_19 = getType<ExprConditional>(expression);
                                        if (expression_19 == (ExprConditional *)0x0) {
                                          expression_20 = getType<ExprAssignment>(expression);
                                          if (expression_20 == (ExprAssignment *)0x0) {
                                            expression_21 = getType<ExprMemberAccess>(expression);
                                            if (expression_21 == (ExprMemberAccess *)0x0) {
                                              expression_22 = getType<ExprArrayIndex>(expression);
                                              if (expression_22 == (ExprArrayIndex *)0x0) {
                                                expression_23 = getType<ExprReturn>(expression);
                                                if (expression_23 == (ExprReturn *)0x0) {
                                                  expression_24 = getType<ExprYield>(expression);
                                                  if (expression_24 == (ExprYield *)0x0) {
                                                    expression_25 =
                                                         getType<ExprVariableDefinition>(expression)
                                                    ;
                                                    if (expression_25 ==
                                                        (ExprVariableDefinition *)0x0) {
                                                      expression_26 =
                                                           getType<ExprZeroInitialize>(expression);
                                                      if (expression_26 == (ExprZeroInitialize *)0x0
                                                         ) {
                                                        expression_27 =
                                                             getType<ExprArraySetup>(expression);
                                                        if (expression_27 == (ExprArraySetup *)0x0)
                                                        {
                                                          expression_28 =
                                                               getType<ExprVariableDefinitions>
                                                                         (expression);
                                                          if (expression_28 ==
                                                              (ExprVariableDefinitions *)0x0) {
                                                            expression_29 =
                                                                 getType<ExprVariableAccess>
                                                                           (expression);
                                                            if (expression_29 ==
                                                                (ExprVariableAccess *)0x0) {
                                                              expression_30 =
                                                                                                                                      
                                                  getType<ExprFunctionContextAccess>(expression);
                                                  if (expression_30 ==
                                                      (ExprFunctionContextAccess *)0x0) {
                                                    expression_31 =
                                                         getType<ExprFunctionDefinition>(expression)
                                                    ;
                                                    if (expression_31 ==
                                                        (ExprFunctionDefinition *)0x0) {
                                                      expression_32 =
                                                           getType<ExprGenericFunctionPrototype>
                                                                     (expression);
                                                      if (expression_32 ==
                                                          (ExprGenericFunctionPrototype *)0x0) {
                                                        expression_33 =
                                                             getType<ExprFunctionAccess>(expression)
                                                        ;
                                                        if (expression_33 ==
                                                            (ExprFunctionAccess *)0x0) {
                                                          bVar1 = isType<ExprFunctionOverloadSet>
                                                                            (expression);
                                                          if (bVar1) {
                                                            __assert_fail("!\"miscompiled tree\"",
                                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                                  ,0xb36,
                                                  "void Translate(ExpressionTranslateContext &, ExprBase *)"
                                                  );
                                                  }
                                                  bVar1 = isType<ExprShortFunctionOverloadSet>
                                                                    (expression);
                                                  if (bVar1) {
                                                    __assert_fail("!\"miscompiled tree\"",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                                  ,0xb38,
                                                  "void Translate(ExpressionTranslateContext &, ExprBase *)"
                                                  );
                                                  }
                                                  expression_34 =
                                                       getType<ExprFunctionCall>(expression);
                                                  if (expression_34 == (ExprFunctionCall *)0x0) {
                                                    expression_35 =
                                                         getType<ExprAliasDefinition>(expression);
                                                    if (expression_35 == (ExprAliasDefinition *)0x0)
                                                    {
                                                      expression_36 =
                                                           getType<ExprClassPrototype>(expression);
                                                      if (expression_36 == (ExprClassPrototype *)0x0
                                                         ) {
                                                        expression_37 =
                                                             getType<ExprGenericClassPrototype>
                                                                       (expression);
                                                        if (expression_37 ==
                                                            (ExprGenericClassPrototype *)0x0) {
                                                          expression_38 =
                                                               getType<ExprClassDefinition>
                                                                         (expression);
                                                          if (expression_38 ==
                                                              (ExprClassDefinition *)0x0) {
                                                            expression_39 =
                                                                 getType<ExprEnumDefinition>
                                                                           (expression);
                                                            if (expression_39 ==
                                                                (ExprEnumDefinition *)0x0) {
                                                              expression_40 =
                                                                   getType<ExprIfElse>(expression);
                                                              if (expression_40 == (ExprIfElse *)0x0
                                                                 ) {
                                                                expression_41 =
                                                                     getType<ExprFor>(expression);
                                                                if (expression_41 == (ExprFor *)0x0)
                                                                {
                                                                  expression_42 =
                                                                       getType<ExprWhile>(expression
                                                                                         );
                                                                  if (expression_42 ==
                                                                      (ExprWhile *)0x0) {
                                                                    expression_43 =
                                                                         getType<ExprDoWhile>
                                                                                   (expression);
                                                                    if (expression_43 ==
                                                                        (ExprDoWhile *)0x0) {
                                                                      expression_44 =
                                                                           getType<ExprSwitch>(
                                                  expression);
                                                  if (expression_44 == (ExprSwitch *)0x0) {
                                                    expression_45 = getType<ExprBreak>(expression);
                                                    if (expression_45 == (ExprBreak *)0x0) {
                                                      expression_46 =
                                                           getType<ExprContinue>(expression);
                                                      if (expression_46 == (ExprContinue *)0x0) {
                                                        expression_47 =
                                                             getType<ExprBlock>(expression);
                                                        if (expression_47 == (ExprBlock *)0x0) {
                                                          expression_48 =
                                                               getType<ExprSequence>(expression);
                                                          if (expression_48 == (ExprSequence *)0x0)
                                                          {
                                                            __assert_fail("!\"unknown type\"",
                                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                                  ,0xb58,
                                                  "void Translate(ExpressionTranslateContext &, ExprBase *)"
                                                  );
                                                  }
                                                  TranslateSequence(ctx,expression_48);
                                                  }
                                                  else {
                                                    TranslateBlock(ctx,expression_47);
                                                  }
                                                  }
                                                  else {
                                                    TranslateContinue(ctx,expression_46);
                                                  }
                                                  }
                                                  else {
                                                    TranslateBreak(ctx,expression_45);
                                                  }
                                                  }
                                                  else {
                                                    TranslateSwitch(ctx,expression_44);
                                                  }
                                                  }
                                                  else {
                                                    TranslateDoWhile(ctx,expression_43);
                                                  }
                                                  }
                                                  else {
                                                    TranslateWhile(ctx,expression_42);
                                                  }
                                                  }
                                                  else {
                                                    TranslateFor(ctx,expression_41);
                                                  }
                                                  }
                                                  else {
                                                    TranslateIfElse(ctx,expression_40);
                                                  }
                                                  }
                                                  else {
                                                    TranslateEnumDefinition(ctx,expression_39);
                                                  }
                                                  }
                                                  else {
                                                    TranslateClassDefinition(ctx,expression_38);
                                                  }
                                                  }
                                                  else {
                                                    TranslateGenericClassPrototype
                                                              (ctx,expression_37);
                                                  }
                                                  }
                                                  else {
                                                    TranslateClassPrototype(ctx,expression_36);
                                                  }
                                                  }
                                                  else {
                                                    TranslateAliasDefinition(ctx,expression_35);
                                                  }
                                                  }
                                                  else {
                                                    TranslateFunctionCall(ctx,expression_34);
                                                  }
                                                  }
                                                  else {
                                                    TranslateFunctionAccess(ctx,expression_33);
                                                  }
                                                  }
                                                  else {
                                                    TranslateGenericFunctionPrototype
                                                              (ctx,expression_32);
                                                  }
                                                  }
                                                  else {
                                                    TranslateFunctionDefinition(ctx,expression_31);
                                                  }
                                                  }
                                                  else {
                                                    TranslateFunctionContextAccess
                                                              (ctx,expression_30);
                                                  }
                                                  }
                                                  else {
                                                    TranslateVariableAccess(ctx,expression_29);
                                                  }
                                                  }
                                                  else {
                                                    TranslateVariableDefinitions(ctx,expression_28);
                                                  }
                                                  }
                                                  else {
                                                    TranslateArraySetup(ctx,expression_27);
                                                  }
                                                  }
                                                  else {
                                                    TranslateZeroInitialize(ctx,expression_26);
                                                  }
                                                  }
                                                  else {
                                                    TranslateVariableDefinition(ctx,expression_25);
                                                  }
                                                  }
                                                  else {
                                                    TranslateYield(ctx,expression_24);
                                                  }
                                                }
                                                else {
                                                  TranslateReturn(ctx,expression_23);
                                                }
                                              }
                                              else {
                                                TranslateArrayIndex(ctx,expression_22);
                                              }
                                            }
                                            else {
                                              TranslateMemberAccess(ctx,expression_21);
                                            }
                                          }
                                          else {
                                            TranslateAssignment(ctx,expression_20);
                                          }
                                        }
                                        else {
                                          TranslateConditional(ctx,expression_19);
                                        }
                                      }
                                      else {
                                        TranslateUnboxing(ctx,expression_18);
                                      }
                                    }
                                    else {
                                      TranslateDereference(ctx,expression_17);
                                    }
                                  }
                                  else {
                                    TranslateGetAddress(ctx,expression_16);
                                  }
                                }
                                else {
                                  TranslateBinaryOp(ctx,expression_15);
                                }
                              }
                              else {
                                TranslateUnaryOp(ctx,expression_14);
                              }
                            }
                            else {
                              TranslateCast(ctx,expression_13);
                            }
                          }
                          else {
                            TranslatePostModify(ctx,expression_12);
                          }
                        }
                        else {
                          TranslatePreModify(ctx,expression_11);
                        }
                      }
                      else {
                        TranslateArray(ctx,expression_10);
                      }
                    }
                    else {
                      TranslatePassthrough(ctx,expression_09);
                    }
                  }
                  else {
                    TranslateFunctionIndexLiteral(ctx,expression_08);
                  }
                }
                else {
                  TranslateNullptrLiteral(ctx,expression_07);
                }
              }
              else {
                TranslateTypeLiteral(ctx,expression_06);
              }
            }
            else {
              TranslateRationalLiteral(ctx,expression_05);
            }
          }
          else {
            TranslateIntegerLiteral(ctx,expression_04);
          }
        }
        else {
          TranslateStringLiteral(ctx,expression_03);
        }
      }
      else {
        TranslateCharacterLiteral(ctx,expression_02);
      }
    }
    else {
      TranslateBoolLiteral(ctx,expression_01);
    }
  }
  else {
    TranslateVoid(ctx,expression_00);
  }
  return;
}

Assistant:

void Translate(ExpressionTranslateContext &ctx, ExprBase *expression)
{
	if(ExprVoid *expr = getType<ExprVoid>(expression))
		TranslateVoid(ctx, expr);
	else if(ExprBoolLiteral *expr = getType<ExprBoolLiteral>(expression))
		TranslateBoolLiteral(ctx, expr);
	else if(ExprCharacterLiteral *expr = getType<ExprCharacterLiteral>(expression))
		TranslateCharacterLiteral(ctx, expr);
	else if(ExprStringLiteral *expr = getType<ExprStringLiteral>(expression))
		TranslateStringLiteral(ctx, expr);
	else if(ExprIntegerLiteral *expr = getType<ExprIntegerLiteral>(expression))
		TranslateIntegerLiteral(ctx, expr);
	else if(ExprRationalLiteral *expr = getType<ExprRationalLiteral>(expression))
		TranslateRationalLiteral(ctx, expr);
	else if(ExprTypeLiteral *expr = getType<ExprTypeLiteral>(expression))
		TranslateTypeLiteral(ctx, expr);
	else if(ExprNullptrLiteral *expr = getType<ExprNullptrLiteral>(expression))
		TranslateNullptrLiteral(ctx, expr);
	else if(ExprFunctionIndexLiteral *expr = getType<ExprFunctionIndexLiteral>(expression))
		TranslateFunctionIndexLiteral(ctx, expr);
	else if(ExprPassthrough *expr = getType<ExprPassthrough>(expression))
		TranslatePassthrough(ctx, expr);
	else if(ExprArray *expr = getType<ExprArray>(expression))
		TranslateArray(ctx, expr);
	else if(ExprPreModify *expr = getType<ExprPreModify>(expression))
		TranslatePreModify(ctx, expr);
	else if(ExprPostModify *expr = getType<ExprPostModify>(expression))
		TranslatePostModify(ctx, expr);
	else if(ExprTypeCast *expr = getType<ExprTypeCast>(expression))
		TranslateCast(ctx, expr);
	else if(ExprUnaryOp *expr = getType<ExprUnaryOp>(expression))
		TranslateUnaryOp(ctx, expr);
	else if(ExprBinaryOp *expr = getType<ExprBinaryOp>(expression))
		TranslateBinaryOp(ctx, expr);
	else if(ExprGetAddress *expr = getType<ExprGetAddress>(expression))
		TranslateGetAddress(ctx, expr);
	else if(ExprDereference *expr = getType<ExprDereference>(expression))
		TranslateDereference(ctx, expr);
	else if(ExprUnboxing *expr = getType<ExprUnboxing>(expression))
		TranslateUnboxing(ctx, expr);
	else if(ExprConditional *expr = getType<ExprConditional>(expression))
		TranslateConditional(ctx, expr);
	else if(ExprAssignment *expr = getType<ExprAssignment>(expression))
		TranslateAssignment(ctx, expr);
	else if(ExprMemberAccess *expr = getType<ExprMemberAccess>(expression))
		TranslateMemberAccess(ctx, expr);
	else if(ExprArrayIndex *expr = getType<ExprArrayIndex>(expression))
		TranslateArrayIndex(ctx, expr);
	else if(ExprReturn *expr = getType<ExprReturn>(expression))
		TranslateReturn(ctx, expr);
	else if(ExprYield *expr = getType<ExprYield>(expression))
		TranslateYield(ctx, expr);
	else if(ExprVariableDefinition *expr = getType<ExprVariableDefinition>(expression))
		TranslateVariableDefinition(ctx, expr);
	else if(ExprZeroInitialize *expr = getType<ExprZeroInitialize>(expression))
		TranslateZeroInitialize(ctx, expr);
	else if(ExprArraySetup *expr = getType<ExprArraySetup>(expression))
		TranslateArraySetup(ctx, expr);
	else if(ExprVariableDefinitions *expr = getType<ExprVariableDefinitions>(expression))
		TranslateVariableDefinitions(ctx, expr);
	else if(ExprVariableAccess *expr = getType<ExprVariableAccess>(expression))
		TranslateVariableAccess(ctx, expr);
	else if(ExprFunctionContextAccess *expr = getType<ExprFunctionContextAccess>(expression))
		TranslateFunctionContextAccess(ctx, expr);
	else if(ExprFunctionDefinition *expr = getType<ExprFunctionDefinition>(expression))
		TranslateFunctionDefinition(ctx, expr);
	else if(ExprGenericFunctionPrototype *expr = getType<ExprGenericFunctionPrototype>(expression))
		TranslateGenericFunctionPrototype(ctx, expr);
	else if(ExprFunctionAccess *expr = getType<ExprFunctionAccess>(expression))
		TranslateFunctionAccess(ctx, expr);
	else if(isType<ExprFunctionOverloadSet>(expression))
		assert(!"miscompiled tree");
	else if(isType<ExprShortFunctionOverloadSet>(expression))
		assert(!"miscompiled tree");
	else if(ExprFunctionCall *expr = getType<ExprFunctionCall>(expression))
		TranslateFunctionCall(ctx, expr);
	else if(ExprAliasDefinition *expr = getType<ExprAliasDefinition>(expression))
		TranslateAliasDefinition(ctx, expr);
	else if(ExprClassPrototype *expr = getType<ExprClassPrototype>(expression))
		TranslateClassPrototype(ctx, expr);
	else if(ExprGenericClassPrototype *expr = getType<ExprGenericClassPrototype>(expression))
		TranslateGenericClassPrototype(ctx, expr);
	else if(ExprClassDefinition *expr = getType<ExprClassDefinition>(expression))
		TranslateClassDefinition(ctx, expr);
	else if(ExprEnumDefinition *expr = getType<ExprEnumDefinition>(expression))
		TranslateEnumDefinition(ctx, expr);
	else if(ExprIfElse *expr = getType<ExprIfElse>(expression))
		TranslateIfElse(ctx, expr);
	else if(ExprFor *expr = getType<ExprFor>(expression))
		TranslateFor(ctx, expr);
	else if(ExprWhile *expr = getType<ExprWhile>(expression))
		TranslateWhile(ctx, expr);
	else if(ExprDoWhile *expr = getType<ExprDoWhile>(expression))
		TranslateDoWhile(ctx, expr);
	else if(ExprSwitch *expr = getType<ExprSwitch>(expression))
		TranslateSwitch(ctx, expr);
	else if(ExprBreak *expr = getType<ExprBreak>(expression))
		TranslateBreak(ctx, expr);
	else if(ExprContinue *expr = getType<ExprContinue>(expression))
		TranslateContinue(ctx, expr);
	else if(ExprBlock *expr = getType<ExprBlock>(expression))
		TranslateBlock(ctx, expr);
	else if(ExprSequence *expr = getType<ExprSequence>(expression))
		TranslateSequence(ctx, expr);
	else
		assert(!"unknown type");
}